

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

GCcdata * argv2cdata(jit_State *J,TRef tr,cTValue *o)

{
  ulong uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef trtypeid;
  GCcdata *cd;
  cTValue *o_local;
  TRef tr_local;
  jit_State *J_local;
  
  if ((tr & 0x1f000000) != 0xa000000) {
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  uVar1 = o->u64;
  (J->fold).ins.field_0.ot = 0x4512;
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  (J->fold).ins.field_0.op2 = 0x16;
  TVar2 = lj_opt_fold(J);
  TVar3 = lj_ir_kint(J,(uint)((GCcdata *)(uVar1 & 0x7fffffffffff))->ctypeid);
  (J->fold).ins.field_0.ot = 0x893;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
  return (GCcdata *)(uVar1 & 0x7fffffffffff);
}

Assistant:

static GCcdata *argv2cdata(jit_State *J, TRef tr, cTValue *o)
{
  GCcdata *cd;
  TRef trtypeid;
  if (!tref_iscdata(tr))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  cd = cdataV(o);
  /* Specialize to the CTypeID. */
  trtypeid = emitir(IRT(IR_FLOAD, IRT_U16), tr, IRFL_CDATA_CTYPEID);
  emitir(IRTG(IR_EQ, IRT_INT), trtypeid, lj_ir_kint(J, (int32_t)cd->ctypeid));
  return cd;
}